

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec2f __thiscall embree::XMLLoader::load<embree::Vec2<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Vec2f VVar1;
  size_type sVar2;
  runtime_error *this_00;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float fVar3;
  float fVar4;
  char *__rhs;
  string local_70 [7];
  undefined1 in_stack_ffffffffffffff97;
  Token *in_stack_ffffffffffffff98;
  ParseLocation *in_stack_ffffffffffffffe8;
  
  sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar2 != 2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = (char *)*in_RDX;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator+(in_RDI,__rhs);
    std::runtime_error::runtime_error(this_00,local_70);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),0);
  fVar3 = Token::Float(in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),1);
  fVar4 = Token::Float(in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  *(float *)in_RDI = fVar3;
  *(float *)&in_RDI->field_0x4 = fVar4;
  VVar1.field_0.field_0.y = 0.0;
  VVar1.field_0.field_0.x = fVar4;
  return (Vec2f)VVar1.field_0;
}

Assistant:

Vec2f XMLLoader::load<Vec2f>(const Ref<XML>& xml) {
    if (xml->body.size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float2 body");
    return Vec2f(xml->body[0].Float(),xml->body[1].Float());
  }